

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

int Abc_NtkPerformMfs(Abc_Ntk_t *pNtk,Sfm_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  Sfm_Ntk_t *p_00;
  int nNodes;
  int nFaninMax;
  Sfm_Ntk_t *p;
  Sfm_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 != 0) {
    Abc_NtkSweep(pNtk,0);
    iVar1 = Abc_NtkGetFaninMax(pNtk);
    if (iVar1 < 0x10) {
      iVar1 = Abc_NtkHasSop(pNtk);
      if ((iVar1 == 0) && (iVar1 = Abc_NtkToSop(pNtk,-1,1000000000), iVar1 == 0)) {
        printf("Conversion to SOP has failed due to low resource limit.\n");
        pNtk_local._4_4_ = 0;
      }
      else {
        p_00 = Abc_NtkExtractMfs(pNtk,pPars->nFirstFixed);
        uVar2 = Sfm_NtkPerform(p_00,pPars);
        if ((uVar2 != 0) && (Abc_NtkInsertMfs(pNtk,p_00), pPars->fVerbose != 0)) {
          Abc_Print(1,"The network has %d nodes changed by \"mfs\".\n",(ulong)uVar2);
        }
        Sfm_NtkFree(p_00);
        pNtk_local._4_4_ = 1;
      }
    }
    else {
      Abc_Print(1,
                "Currently \"mfs\" cannot process the network containing nodes with more than 15 fanins.\n"
               );
      pNtk_local._4_4_ = 1;
    }
    return pNtk_local._4_4_;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                ,0x160,"int Abc_NtkPerformMfs(Abc_Ntk_t *, Sfm_Par_t *)");
}

Assistant:

int Abc_NtkPerformMfs( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars )
{
    Sfm_Ntk_t * p;
    int nFaninMax, nNodes;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkSweep( pNtk, 0 );
    // count fanouts
    nFaninMax = Abc_NtkGetFaninMax( pNtk );
    if ( nFaninMax > 15 )
    {
        Abc_Print( 1, "Currently \"mfs\" cannot process the network containing nodes with more than 15 fanins.\n" );
        return 1;
    }
    if ( !Abc_NtkHasSop(pNtk) )
        if ( !Abc_NtkToSop( pNtk, -1, ABC_INFINITY ) )
        {
            printf( "Conversion to SOP has failed due to low resource limit.\n" );
            return 0;
        }
    // collect information
    p = Abc_NtkExtractMfs( pNtk, pPars->nFirstFixed );
    // perform optimization
    nNodes = Sfm_NtkPerform( p, pPars );
    if ( nNodes == 0 )
    {
//        Abc_Print( 1, "The network is not changed by \"mfs\".\n" );
    }
    else
    {
        Abc_NtkInsertMfs( pNtk, p );
        if( pPars->fVerbose )
            Abc_Print( 1, "The network has %d nodes changed by \"mfs\".\n", nNodes );
    }
    Sfm_NtkFree( p );
    return 1;
}